

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_c_binding.cpp
# Opt level: O2

uint32_t __thiscall
basis_file::getImageHeight(basis_file *this,uint32_t image_index,uint32_t level_index)

{
  char cVar1;
  uint32_t uVar2;
  uint32_t orig_height;
  uint32_t total_blocks;
  uint32_t orig_width;
  
  if (this->m_magic == 0xdeadbee1) {
    cVar1 = basist::basisu_transcoder::get_image_level_desc
                      (&this->m_transcoder,(uint)this->m_file,this->byteLength,image_index,
                       (uint *)(ulong)level_index,&orig_width,&orig_height);
    uVar2 = 0;
    if (cVar1 != '\0') {
      uVar2 = orig_height;
    }
    return uVar2;
  }
  __assert_fail("m_magic == MAGIC",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/interface/basisu_c_binding/src/basisu_c_binding.cpp"
                ,0x4f,"uint32_t basis_file::getImageHeight(uint32_t, uint32_t)");
}

Assistant:

uint32_t basis_file::getImageHeight(uint32_t image_index, uint32_t level_index) {
    assert(m_magic == MAGIC);
    if (m_magic != MAGIC)
        return 0;

    uint32_t orig_width, orig_height, total_blocks;
    if (!m_transcoder.get_image_level_desc(m_file, byteLength,
                                           image_index, level_index,
                                           orig_width, orig_height,
                                           total_blocks))
        return 0;

    return orig_height;
}